

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O0

char * inform_strerror(inform_error *err)

{
  inform_error *err_local;
  
  if (err == (inform_error *)0x0) {
    err_local = (inform_error *)anon_var_dwarf_11f5f;
  }
  else {
    switch(*err) {
    case INFORM_SUCCESS:
      err_local = (inform_error *)anon_var_dwarf_11f5f;
      break;
    case INFORM_EFAULT:
      err_local = (inform_error *)anon_var_dwarf_11f93;
      break;
    case INFORM_EARG:
      err_local = (inform_error *)anon_var_dwarf_11fa9;
      break;
    case INFORM_ENOMEM:
      err_local = (inform_error *)anon_var_dwarf_11fbf;
      break;
    case INFORM_ETIMESERIES:
      err_local = (inform_error *)anon_var_dwarf_11fd5;
      break;
    case INFORM_ENOSOURCES:
      err_local = (inform_error *)anon_var_dwarf_11feb;
      break;
    case INFORM_ENOINITS:
      err_local = (inform_error *)anon_var_dwarf_11ff5;
      break;
    case INFORM_ESHORTSERIES:
      err_local = (inform_error *)anon_var_dwarf_1200b;
      break;
    case INFORM_EKZERO:
      err_local = (inform_error *)anon_var_dwarf_12021;
      break;
    case INFORM_EKLONG:
      err_local = (inform_error *)anon_var_dwarf_12037;
      break;
    case INFORM_EBASE:
      err_local = (inform_error *)anon_var_dwarf_1204d;
      break;
    case INFORM_ENEGSTATE:
      err_local = (inform_error *)anon_var_dwarf_12057;
      break;
    case INFORM_EBADSTATE:
      err_local = (inform_error *)anon_var_dwarf_1206d;
      break;
    case INFORM_EDIST:
      err_local = (inform_error *)anon_var_dwarf_12083;
      break;
    case INFORM_EBIN:
      err_local = (inform_error *)anon_var_dwarf_12099;
      break;
    case INFORM_EENCODE:
      err_local = (inform_error *)anon_var_dwarf_120a3;
      break;
    case INFORM_ETPM:
      err_local = (inform_error *)anon_var_dwarf_120ad;
      break;
    case INFORM_ETPMROW:
      err_local = (inform_error *)anon_var_dwarf_120c3;
      break;
    case INFORM_ESIZE:
      err_local = (inform_error *)anon_var_dwarf_120d9;
      break;
    case INFORM_EPARTS:
      err_local = (inform_error *)anon_var_dwarf_120ef;
      break;
    case INFORM_FAILURE:
      err_local = (inform_error *)anon_var_dwarf_11f7d;
      break;
    default:
      err_local = (inform_error *)anon_var_dwarf_12105;
    }
  }
  return (char *)err_local;
}

Assistant:

char const *inform_strerror(inform_error const *err)
{
    if (err == NULL)
    {
        return "success";
    }
    switch (*err)
    {
        case INFORM_SUCCESS:      return "success";
        case INFORM_FAILURE:      return "generic failure";
        case INFORM_EFAULT:       return "invalid pointer encountered";
        case INFORM_EARG:         return "invalid argument provided";
        case INFORM_ENOMEM:       return "memory allocation failed";
        case INFORM_ETIMESERIES:  return "timeseries is NULL";
        case INFORM_ENOSOURCES:   return "timeseries has no sources";
        case INFORM_ENOINITS:     return "timeseries has no initial conditions";
        case INFORM_ESHORTSERIES: return "timeseries is too short";
        case INFORM_EKZERO:       return "history length is zero";
        case INFORM_EKLONG:       return "history length is too long";
        case INFORM_EBASE:        return "base is invalid";
        case INFORM_ENEGSTATE:    return "negative state in timeseries";
        case INFORM_EBADSTATE:    return "unexpected state in timeseries";
        case INFORM_EDIST:        return "invalid distribution encountered";
        case INFORM_EBIN:         return "invalid binning";
        case INFORM_EENCODE:      return "encoding/decoding failed";
        case INFORM_ETPM:         return "invalid TPM";
        case INFORM_ETPMROW:      return "all zero row in TPM";
        case INFORM_ESIZE:        return "invalid size";
        case INFORM_EPARTS:       return "invalid partitioning";
        default:                  return "unrecognized error";
    }
}